

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildingState.cpp
# Opt level: O0

void BuildingState::CmdBuildRoom
               (string *input,shared_ptr<Connection> *connection,shared_ptr<GameData> *game_data)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *this_00;
  unsigned_long uVar1;
  long lVar2;
  ostream *poVar3;
  shared_ptr<GameData> local_2c0;
  shared_ptr<Connection> local_2b0;
  __cxx11 local_2a0 [32];
  shared_ptr<GameData> local_280;
  shared_ptr<Connection> local_270;
  string local_260 [32];
  Tokenizer local_240 [32];
  stringstream local_220 [8];
  stringstream ss;
  ostream local_210 [376];
  string local_98 [8];
  string input_string;
  shared_ptr<Room> local_78;
  unsigned_long local_68;
  u_long room_num;
  shared_ptr<Room> room;
  undefined1 local_40 [8];
  shared_ptr<Planet> planet;
  shared_ptr<Player> player;
  shared_ptr<GameData> *game_data_local;
  shared_ptr<Connection> *connection_local;
  string *input_local;
  
  std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)connection
            );
  this = &planet.super___shared_ptr<Planet,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  Connection::GetPlayer((Connection *)this);
  std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  Entity::GetPlanet((Entity *)local_40);
  std::make_shared<Room>();
  this_00 = std::__shared_ptr_access<Planet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Planet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_40);
  std::shared_ptr<Room>::shared_ptr(&local_78,(shared_ptr<Room> *)&room_num);
  uVar1 = Area::AddRoom(&this_00->super_Area,&local_78);
  std::shared_ptr<Room>::~shared_ptr(&local_78);
  local_68 = uVar1;
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    std::__cxx11::string::string(local_98,(string *)input);
    std::__cxx11::stringstream::stringstream(local_220);
    Tokenizer::GetFirstToken(local_240,(string *)local_98);
    poVar3 = std::operator<<(local_210,(string *)local_240);
    std::operator<<(poVar3," ");
    std::__cxx11::string::~string((string *)local_240);
    poVar3 = (ostream *)std::ostream::operator<<(local_210,local_68);
    std::operator<<(poVar3," ");
    std::operator<<(local_210,local_98);
    std::__cxx11::stringstream::str();
    std::shared_ptr<Connection>::shared_ptr(&local_270,connection);
    std::shared_ptr<GameData>::shared_ptr(&local_280,game_data);
    CmdLink(local_260,&local_270,&local_280);
    std::shared_ptr<GameData>::~shared_ptr(&local_280);
    std::shared_ptr<Connection>::~shared_ptr(&local_270);
    std::__cxx11::string::~string((string *)local_260);
    std::__cxx11::stringstream::~stringstream(local_220);
    std::__cxx11::string::~string(local_98);
  }
  std::__cxx11::to_string(local_2a0,local_68);
  std::shared_ptr<Connection>::shared_ptr(&local_2b0,connection);
  std::shared_ptr<GameData>::shared_ptr(&local_2c0,game_data);
  PlayingState::CmdGoto((string *)local_2a0,&local_2b0,&local_2c0);
  std::shared_ptr<GameData>::~shared_ptr(&local_2c0);
  std::shared_ptr<Connection>::~shared_ptr(&local_2b0);
  std::__cxx11::string::~string((string *)local_2a0);
  std::shared_ptr<Room>::~shared_ptr((shared_ptr<Room> *)&room_num);
  std::shared_ptr<Planet>::~shared_ptr((shared_ptr<Planet> *)local_40);
  std::shared_ptr<Player>::~shared_ptr
            ((shared_ptr<Player> *)
             &planet.super___shared_ptr<Planet,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void BuildingState::CmdBuildRoom(const std::string &input, std::shared_ptr<Connection> connection,
                                 std::shared_ptr<GameData> game_data) {
    auto player = connection->GetPlayer();
    auto planet = player->GetPlanet();
    std::shared_ptr<Room> room = std::make_shared<Room>();
    u_long room_num = planet->AddRoom(room);
    if(input.length() > 0)
    {
        std::string input_string = std::string(input);
        std::stringstream ss;
        ss << Tokenizer::GetFirstToken(input_string) << " ";
        ss << room_num << " ";
        ss << input_string;
        CmdLink(ss.str(), connection, game_data);
    }
    CmdGoto(std::to_string(room_num), connection, game_data);
}